

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

void __thiscall
slang::syntax::StandardRsCaseItemSyntax::setChild
          (StandardRsCaseItemSyntax *this,size_t index,TokenOrSyntax child)

{
  long in_RSI;
  
  (*(code *)(&DAT_004738a0 + *(int *)(&DAT_004738a0 + in_RSI * 4)))();
  return;
}

Assistant:

void StandardRsCaseItemSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: expressions = child.node()->as<SeparatedSyntaxList<ExpressionSyntax>>(); return;
        case 1: colon = child.token(); return;
        case 2: item = child.node() ? &child.node()->as<RsProdItemSyntax>() : nullptr; return;
        case 3: semi = child.token(); return;
        default: SLANG_UNREACHABLE;
    }
}